

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O0

void __thiscall
Psbt_SetInputOnlySimpleWitness_Test::TestBody(Psbt_SetInputOnlySimpleWitness_Test *this)

{
  bool bVar1;
  uint32_t index;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_828;
  Message local_820;
  string local_818;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar_4;
  undefined1 local_7d0 [8];
  Psbt psbt2;
  Message local_778;
  ByteData local_770;
  string local_758;
  undefined1 local_738 [8];
  AssertionResult gtest_ar_3;
  Message local_720;
  undefined1 local_718 [28];
  uint32_t local_6fc;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_6c8;
  Message local_6c0;
  bool local_6b1;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_680;
  Message local_678;
  bool local_669;
  undefined1 local_668 [8];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  CfdException *except_1;
  AssertionResult gtest_ar;
  CfdException *except;
  AbstractTxInReference local_5b8;
  Transaction local_528;
  TxOutReference local_4e8;
  undefined1 local_498 [8];
  Transaction tx;
  KeyData key2;
  KeyData key1;
  undefined1 local_140 [8];
  string path2;
  undefined1 local_118 [8];
  string path1;
  undefined1 local_e0 [8];
  HDWallet wallet2;
  undefined1 local_b0 [8];
  HDWallet wallet1;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  Psbt psbt;
  Psbt_SetInputOnlySimpleWitness_Test *this_local;
  
  psbt.base_tx_.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_80,
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA=="
             ,&local_81);
  cfd::core::Psbt::Psbt((Psbt *)local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet
            ((HDWallet *)local_b0,
             (ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::ByteData((ByteData *)((long)&path1.field_2 + 8),&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet((HDWallet *)local_e0,(ByteData *)((long)&path1.field_2 + 8));
  cfd::core::ByteData::~ByteData((ByteData *)((long)&path1.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_118,"44h/0h/0h/1/1",(allocator *)(path2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(path2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_140,"44h/0h/0h/0/1",
             (allocator *)
             ((long)&key1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&key1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::HDWallet::GeneratePubkeyData
            ((KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(HDWallet *)local_b0,kTestnet,
             (string *)local_118,kNormal);
  cfd::core::HDWallet::GeneratePubkeyData
            ((KeyData *)
             &tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(HDWallet *)local_e0,kTestnet,
             (string *)local_140,kNormal);
  cfd::core::Psbt::GetTransaction((Transaction *)local_498,(Psbt *)local_60);
  cfd::core::Transaction::Transaction(&local_528,&g_psbt_utxo_witness_abi_cxx11_);
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_5b8,(Transaction *)local_498,0);
  index = cfd::core::AbstractTxInReference::GetVout(&local_5b8);
  cfd::core::Transaction::GetTxOut(&local_4e8,&local_528,index);
  cfd::core::Psbt::SetTxInUtxo
            ((Psbt *)local_60,0,&local_4e8,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::TxOutReference::~TxOutReference(&local_4e8);
  cfd::core::TxInReference::~TxInReference((TxInReference *)&local_5b8);
  cfd::core::Transaction::~Transaction(&local_528);
  cfd::core::SigHashType::SigHashType((SigHashType *)((long)&except + 4));
  cfd::core::Psbt::SetTxInSighashType((Psbt *)local_60,0,(SigHashType *)((long)&except + 4));
  cfd::core::Transaction::~Transaction((Transaction *)local_498);
  cfd::core::Transaction::Transaction((Transaction *)&except_1,&g_psbt_utxo_legacy_abi_cxx11_);
  cfd::core::Psbt::SetTxInUtxo
            ((Psbt *)local_60,1,(Transaction *)&except_1,
             (KeyData *)
             &tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Transaction::~Transaction((Transaction *)&except_1);
  local_669 = cfd::core::Psbt::IsFindTxInSighashType((Psbt *)local_60,0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_668,&local_669,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
  if (!bVar1) {
    testing::Message::Message(&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_668,
               (AssertionResult *)"psbt.IsFindTxInSighashType(0)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_680,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x203,pcVar2);
    testing::internal::AssertHelper::operator=(&local_680,&local_678);
    testing::internal::AssertHelper::~AssertHelper(&local_680);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_678);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
  bVar1 = cfd::core::Psbt::IsFindTxInSighashType((Psbt *)local_60,1);
  local_6b1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6b0,&local_6b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
  if (!bVar1) {
    testing::Message::Message(&local_6c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_6b0,
               (AssertionResult *)"psbt.IsFindTxInSighashType(1)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x204,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6c8,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper(&local_6c8);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
  cfd::core::SigHashType::SigHashType((SigHashType *)(local_718 + 0x10));
  local_6fc = cfd::core::SigHashType::GetSigHashFlag((SigHashType *)(local_718 + 0x10));
  cfd::core::Psbt::GetTxInSighashType((Psbt *)local_718,(uint32_t)local_60);
  local_718._12_4_ = cfd::core::SigHashType::GetSigHashFlag((SigHashType *)local_718);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_6f8,"SigHashType().GetSigHashFlag()",
             "psbt.GetTxInSighashType(0).GetSigHashFlag()",&local_6fc,(uint *)(local_718 + 0xc));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
  if (!bVar1) {
    testing::Message::Message(&local_720);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x205,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_720);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_720);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
  cfd::core::Psbt::GetData(&local_770,(Psbt *)local_60);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_758,&local_770);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_738,
             "\"70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff00000000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff00000000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_758);
  cfd::core::ByteData::~ByteData(&local_770);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_738);
  if (!bVar1) {
    testing::Message::Message(&local_778);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_738);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x207,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_778);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_778);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_738);
  cfd::core::Psbt::GetData((ByteData *)&gtest_ar_4.message_,(Psbt *)local_60);
  cfd::core::Psbt::Psbt((Psbt *)local_7d0,(ByteData *)&gtest_ar_4.message_);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_4.message_);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_818,(Psbt *)local_7d0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7f8,
             "\"cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA==\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA=="
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_818);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
  if (!bVar1) {
    testing::Message::Message(&local_820);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_828,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x209,pcVar2);
    testing::internal::AssertHelper::operator=(&local_828,&local_820);
    testing::internal::AssertHelper::~AssertHelper(&local_828);
    testing::Message::~Message(&local_820);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
  cfd::core::Psbt::~Psbt((Psbt *)local_7d0);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_118);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_e0);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_b0);
  cfd::core::Psbt::~Psbt((Psbt *)local_60);
  return;
}

Assistant:

TEST(Psbt, SetInputOnlySimpleWitness) {
  Psbt psbt("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==");

  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/1/1";
  std::string path2 = "44h/0h/0h/0/1";

  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  try {
    auto tx = psbt.GetTransaction();
    psbt.SetTxInUtxo(0, Transaction(g_psbt_utxo_witness).GetTxOut(tx.GetTxIn(0).GetVout()), key1);
    psbt.SetTxInSighashType(0, SigHashType());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    psbt.SetTxInUtxo(1, Transaction(g_psbt_utxo_legacy), key2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  EXPECT_TRUE(psbt.IsFindTxInSighashType(0));
  EXPECT_FALSE(psbt.IsFindTxInSighashType(1));
  EXPECT_EQ(SigHashType().GetSigHashFlag(), psbt.GetTxInSighashType(0).GetSigHashFlag());

  EXPECT_STREQ("70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff00000000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000", psbt.GetData().GetHex().c_str());
  Psbt psbt2(psbt.GetData());
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA==", psbt2.GetBase64().c_str());
}